

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O3

void __thiscall
bloaty::RangeMapTest_UnknownSize_Test::RangeMapTest_UnknownSize_Test
          (RangeMapTest_UnknownSize_Test *this)

{
  _Rb_tree_header *p_Var1;
  
  testing::Test::Test((Test *)this);
  p_Var1 = &(this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header;
  (this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var1;
  (this->super_RangeMapTest).map_.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header;
  (this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var1;
  (this->super_RangeMapTest).map2_.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header;
  (this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header._M_header +
   0x18) = p_Var1;
  (this->super_RangeMapTest).map3_.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined4 *)&(this->super_RangeMapTest).kNoTranslation = 0xffffffff;
  *(undefined4 *)((long)&(this->super_RangeMapTest).kNoTranslation + 4) = 0xffffffff;
  *(undefined4 *)&(this->super_RangeMapTest).kUnknownSize = 0xffffffff;
  *(undefined4 *)((long)&(this->super_RangeMapTest).kUnknownSize + 4) = 0xffffffff;
  (this->super_RangeMapTest).super_Test._vptr_Test = (_func_int **)&PTR__RangeMapTest_0061d8c8;
  return;
}

Assistant:

TEST_F(RangeMapTest, UnknownSize) {
  map_.AddRange(5, kUnknownSize, "foo");
  CheckConsistency();
  AssertMainMapEquals({
    {5, UINT64_MAX, kNoTranslation, "foo"}
  });

  map_.AddRange(100, 15, "bar");
  map_.AddRange(200, kUnknownSize, "baz");
  CheckConsistency();
  AssertMainMapEquals({
    {5, 100, kNoTranslation, "foo"},
    {100, 115, kNoTranslation, "bar"},
    {200, UINT64_MAX, kNoTranslation, "baz"}
  });

  map2_.AddRange(5, 110, "base0");
  map2_.AddRange(200, 50, "base1");

  AssertRollupEquals({&map2_, &map_}, {
    {{"base0", "foo"}, 5, 100},
    {{"base0", "bar"}, 100, 115},
    {{"base1", "baz"}, 200, 250},
  });
}